

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax(UnaryPropertyExprSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  AssertionExpr *this;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar3;
  ASTContext local_80;
  AssertionExpr *local_48;
  AssertionExpr *expr;
  Compilation *comp;
  bitmask<slang::ast::ASTFlags> local_30;
  bitmask<slang::ast::ASTFlags> local_28;
  bitmask<slang::ast::ASTFlags> extraFlags;
  UnaryAssertionOperator op;
  ASTContext *context_local;
  UnaryPropertyExprSyntax *syntax_local;
  
  extraFlags.m_bits._4_4_ = getUnaryOp((syntax->op).kind);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_28);
  if (extraFlags.m_bits._4_4_ == NextTime) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_30,PropertyTimeAdvance);
    local_28.m_bits = local_30.m_bits;
  }
  else {
    bVar1 = isNegationOp(extraFlags.m_bits._4_4_);
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&comp,PropertyNegation);
      local_28.m_bits = (underlying_type)comp;
    }
  }
  expr = (AssertionExpr *)ASTContext::getCompilation(context);
  this = (AssertionExpr *)not_null<slang::syntax::PropertyExprSyntax_*>::operator*(&syntax->expr);
  ASTContext::resetFlags(&local_80,context,local_28);
  iVar2 = AssertionExpr::bind(this,(int)&local_80,(sockaddr *)0x0,0);
  local_48 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
  pUVar3 = BumpAllocator::
           emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::nullopt_t_const&>
                     ((BumpAllocator *)expr,(UnaryAssertionOperator *)((long)&extraFlags.m_bits + 4)
                      ,local_48,(nullopt_t *)&std::nullopt);
  return &pUVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnaryPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto op = getUnaryOp(syntax.op.kind);

    bitmask<ASTFlags> extraFlags;
    if (op == UnaryAssertionOperator::NextTime)
        extraFlags = ASTFlags::PropertyTimeAdvance;
    else if (isNegationOp(op))
        extraFlags = ASTFlags::PropertyNegation;

    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));
    return *comp.emplace<UnaryAssertionExpr>(op, expr, std::nullopt);
}